

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_UInt16 FT_Stream_GetUShortLE(FT_Stream stream)

{
  FT_UInt16 *pFVar1;
  FT_UInt16 local_1a;
  FT_UInt16 *pFStack_18;
  FT_UInt16 result;
  FT_Byte *p;
  FT_Stream stream_local;
  
  local_1a = 0;
  pFVar1 = (FT_UInt16 *)stream->cursor;
  pFStack_18 = pFVar1;
  if ((uchar *)((long)pFVar1 + 1U) < stream->limit) {
    pFStack_18 = pFVar1 + 1;
    local_1a = *pFVar1;
  }
  stream->cursor = (uchar *)pFStack_18;
  return local_1a;
}

Assistant:

FT_BASE_DEF( FT_UInt16 )
  FT_Stream_GetUShortLE( FT_Stream  stream )
  {
    FT_Byte*   p;
    FT_UInt16  result;


    FT_ASSERT( stream && stream->cursor );

    result         = 0;
    p              = stream->cursor;
    if ( p + 1 < stream->limit )
      result       = FT_NEXT_USHORT_LE( p );
    stream->cursor = p;

    return result;
  }